

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservableDictionaryExample.cpp
# Opt level: O0

void __thiscall DictListener::OnItemRemoved(DictListener *this,int *k,string *v)

{
  LoggerWriter *pLVar1;
  LoggerWriter local_1b8;
  string *local_20;
  string *v_local;
  int *k_local;
  DictListener *this_local;
  
  local_20 = v;
  v_local = (string *)k;
  k_local = (int *)this;
  Logger::Log(&local_1b8,Info);
  pLVar1 = Logger::LoggerWriter::operator<<
                     (&local_1b8,(char (*) [29])"DictListener::OnItemRemoved(");
  pLVar1 = Logger::LoggerWriter::operator<<(pLVar1,(int *)v_local);
  pLVar1 = Logger::LoggerWriter::operator<<(pLVar1,(char (*) [3])", ");
  pLVar1 = Logger::LoggerWriter::operator<<(pLVar1,local_20);
  Logger::LoggerWriter::operator<<(pLVar1,(char (*) [2])")");
  Logger::LoggerWriter::~LoggerWriter(&local_1b8);
  return;
}

Assistant:

virtual void OnItemRemoved(const int& k, const std::string& v)
    {
        Logger::Log(LogLevel::Info) << "DictListener::OnItemRemoved(" << k << ", " << v << ")";
    }